

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O3

void spvtools::val::printDominatorList(BasicBlock *b)

{
  ostream *poVar1;
  BasicBlock *pBVar2;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," is dominated by: ",0x12);
  pBVar2 = BasicBlock::immediate_dominator(b);
  if (pBVar2 != b) {
    do {
      b = BasicBlock::immediate_dominator(b);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      pBVar2 = BasicBlock::immediate_dominator(b);
    } while (pBVar2 != b);
  }
  return;
}

Assistant:

void printDominatorList(const BasicBlock& b) {
  std::cout << b.id() << " is dominated by: ";
  const BasicBlock* bb = &b;
  while (bb->immediate_dominator() != bb) {
    bb = bb->immediate_dominator();
    std::cout << bb->id() << " ";
  }
}